

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O1

int Sml_CompareMaxId(unsigned_short *pImp1,unsigned_short *pImp2)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  
  uVar2 = pImp1[1];
  if (pImp1[1] < *pImp1) {
    uVar2 = *pImp1;
  }
  uVar3 = pImp2[1];
  if (pImp2[1] < *pImp2) {
    uVar3 = *pImp2;
  }
  uVar1 = 0xffffffff;
  if (uVar3 <= uVar2) {
    uVar1 = (uint)(uVar3 < uVar2);
  }
  return uVar1;
}

Assistant:

int Sml_CompareMaxId( unsigned short * pImp1, unsigned short * pImp2 )
{
    int Max1 = Abc_MaxInt( pImp1[0], pImp1[1] );
    int Max2 = Abc_MaxInt( pImp2[0], pImp2[1] );
    if ( Max1 < Max2 )
        return -1;
    if ( Max1 > Max2  )
        return 1;
    return 0; 
}